

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O3

outlier_classification * __thiscall
nonius::detail::
classify_outliers<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
          (outlier_classification *__return_storage_ptr__,detail *this,
          __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> first,
          __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  vector<double,_std::allocator<double>_> copy;
  allocator_type local_41;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_40;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_38;
  long local_30;
  double local_28;
  
  std::vector<double,std::allocator<double>>::
  vector<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,void>
            ((vector<double,std::allocator<double>> *)&local_40,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)this,first,
             &local_41);
  local_28 = weighted_average_quantile<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                       (1,4,local_40,local_38);
  dVar7 = weighted_average_quantile<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                    (3,4,local_40,local_38);
  __return_storage_ptr__->low_severe = 0;
  __return_storage_ptr__->low_mild = 0;
  __return_storage_ptr__->high_mild = 0;
  __return_storage_ptr__->high_severe = 0;
  if (this == (detail *)first._M_current) {
    iVar2 = 0;
  }
  else {
    dVar9 = (dVar7 - local_28) * 3.0;
    dVar8 = (dVar7 - local_28) * 1.5;
    iVar3 = 0;
    iVar4 = 0;
    iVar5 = 0;
    iVar6 = 0;
    iVar2 = 0;
    do {
      dVar1 = *(double *)this;
      if (local_28 - dVar9 <= dVar1) {
        if (local_28 - dVar8 <= dVar1) {
          if (dVar1 <= dVar9 + dVar7) {
            if (dVar8 + dVar7 < dVar1) {
              iVar6 = iVar6 + 1;
            }
          }
          else {
            iVar5 = iVar5 + 1;
          }
        }
        else {
          iVar4 = iVar4 + 1;
        }
      }
      else {
        iVar3 = iVar3 + 1;
      }
      iVar2 = iVar2 + 1;
      this = this + 8;
    } while (this != (detail *)first._M_current);
    __return_storage_ptr__->high_mild = iVar6;
    __return_storage_ptr__->high_severe = iVar5;
    __return_storage_ptr__->low_mild = iVar4;
    __return_storage_ptr__->low_severe = iVar3;
  }
  __return_storage_ptr__->samples_seen = iVar2;
  if (local_40._M_current != (double *)0x0) {
    operator_delete(local_40._M_current,local_30 - (long)local_40._M_current);
  }
  return __return_storage_ptr__;
}

Assistant:

outlier_classification classify_outliers(Iterator first, Iterator last) {
            std::vector<double> copy(first, last);

            auto q1 = weighted_average_quantile(1, 4, copy.begin(), copy.end());
            auto q3 = weighted_average_quantile(3, 4, copy.begin(), copy.end());
            auto iqr = q3 - q1;
            auto los = q1 - (iqr * 3.);
            auto lom = q1 - (iqr * 1.5);
            auto him = q3 + (iqr * 1.5);
            auto his = q3 + (iqr * 3.);

            outlier_classification o;
            for(; first != last; ++first) {
                auto&& t = *first;
                if(t < los) ++o.low_severe;
                else if(t < lom) ++o.low_mild;
                else if(t > his) ++o.high_severe;
                else if(t > him) ++o.high_mild;
                ++o.samples_seen;
            }
            return o;
        }